

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O1

void SplitByteVectorDistance
               (MemoryManager *m,uint16_t *data,size_t length,size_t literals_per_histogram,
               size_t max_histograms,size_t sampling_stride_length,double block_switch_cost,
               BrotliEncoderParams *params,BlockSplit *split)

{
  int *piVar1;
  byte *pbVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  ushort uVar6;
  size_t byte_ix;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  ushort *puVar11;
  void *pvVar12;
  void *pvVar13;
  void *__s;
  void *p;
  ulong uVar14;
  uint32_t *cluster_size;
  HistogramDistance *pHVar15;
  uint32_t *__dest;
  uint32_t *puVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  uint *puVar23;
  void *pvVar24;
  byte bVar25;
  uint uVar26;
  long lVar27;
  byte bVar28;
  uint uVar29;
  uint *puVar30;
  size_t block_idx;
  long lVar31;
  ulong uVar32;
  size_t sVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  HistogramDistance *local_d70;
  long local_d58;
  HistogramDistance *local_d50;
  uint32_t *local_d40;
  ulong local_d30;
  long local_d08;
  HistogramDistance *local_cf0;
  long local_ce8;
  HistogramPair *local_ce0;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  HistogramDistance local_8c0;
  
  uVar14 = length / 0x220 + 1;
  if (literals_per_histogram <= length / 0x220) {
    uVar14 = literals_per_histogram;
  }
  if (length == 0) {
    *(undefined8 *)sampling_stride_length = 1;
  }
  else if (length < 0x80) {
    uVar14 = *(ulong *)(sampling_stride_length + 0x20);
    uVar7 = *(long *)(sampling_stride_length + 8) + 1;
    if (uVar14 < uVar7) {
      if (uVar14 == 0) {
        uVar14 = uVar7;
      }
      do {
        uVar10 = uVar14;
        uVar14 = uVar10 * 2;
      } while (uVar10 < uVar7);
      if (uVar10 == 0) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = BrotliAllocate(m,uVar10);
      }
      if (*(size_t *)(sampling_stride_length + 0x20) != 0) {
        memcpy(pvVar8,*(void **)(sampling_stride_length + 0x10),
               *(size_t *)(sampling_stride_length + 0x20));
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x10));
      *(void **)(sampling_stride_length + 0x10) = pvVar8;
      *(ulong *)(sampling_stride_length + 0x20) = uVar10;
    }
    uVar14 = *(ulong *)(sampling_stride_length + 0x28);
    uVar7 = *(long *)(sampling_stride_length + 8) + 1;
    if (uVar14 < uVar7) {
      if (uVar14 == 0) {
        uVar14 = uVar7;
      }
      do {
        uVar10 = uVar14;
        uVar14 = uVar10 * 2;
      } while (uVar10 < uVar7);
      if (uVar10 == 0) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = BrotliAllocate(m,uVar10 * 4);
      }
      if (*(long *)(sampling_stride_length + 0x28) != 0) {
        memcpy(pvVar8,*(void **)(sampling_stride_length + 0x18),
               *(long *)(sampling_stride_length + 0x28) << 2);
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x18));
      *(void **)(sampling_stride_length + 0x18) = pvVar8;
      *(ulong *)(sampling_stride_length + 0x28) = uVar10;
    }
    *(undefined8 *)sampling_stride_length = 1;
    *(undefined1 *)
     (*(long *)(sampling_stride_length + 0x10) + *(long *)(sampling_stride_length + 8)) = 0;
    lVar31 = *(long *)(sampling_stride_length + 8);
    *(int *)(*(long *)(sampling_stride_length + 0x18) + lVar31 * 4) = (int)length;
    *(long *)(sampling_stride_length + 8) = lVar31 + 1;
  }
  else {
    pvVar9 = BrotliAllocate(m,uVar14 * 0x890);
    lVar22 = uVar14 + (uVar14 == 0);
    pvVar8 = pvVar9;
    lVar31 = lVar22;
    do {
      memset(pvVar8,0,0x888);
      *(undefined8 *)((long)pvVar8 + 0x888) = 0x7ff0000000000000;
      pvVar8 = (void *)((long)pvVar8 + 0x890);
      lVar31 = lVar31 + -1;
    } while (lVar31 != 0);
    lVar31 = 0;
    uVar7 = 7;
    do {
      uVar10 = (lVar31 * length) / uVar14;
      if (lVar31 != 0) {
        uVar7 = (ulong)(uint)((int)uVar7 * 0x41a7);
        uVar10 = uVar10 + uVar7 % (length / uVar14);
      }
      if (length <= uVar10 + 0x28) {
        uVar10 = length - 0x29;
      }
      plVar3 = (long *)((long)pvVar9 + lVar31 * 0x890 + 0x880);
      *plVar3 = *plVar3 + 0x28;
      lVar27 = 0;
      do {
        piVar1 = (int *)((long)pvVar9 + (ulong)data[uVar10 + lVar27] * 4 + lVar31 * 0x890);
        *piVar1 = *piVar1 + 1;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x28);
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar22);
    uVar7 = (length * 2) / 0x28 + uVar14 + 99;
    if (uVar7 != uVar7 % uVar14) {
      uVar32 = 7;
      uVar10 = 0;
      do {
        memset(&local_8c0,0,0x888);
        local_8c0.bit_cost_ = INFINITY;
        uVar32 = (ulong)(uint)((int)uVar32 * 0x41a7);
        puVar11 = data + uVar32 % (length - 0x27);
        local_8c0.total_count_ = 0x28;
        lVar31 = -0x28;
        do {
          uVar6 = *puVar11;
          puVar11 = puVar11 + 1;
          local_8c0.data_[uVar6] = local_8c0.data_[uVar6] + 1;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0);
        lVar31 = (uVar10 % uVar14) * 0x890;
        plVar3 = (long *)((long)pvVar9 + lVar31 + 0x880);
        *plVar3 = *plVar3 + 0x28;
        lVar22 = 0;
        do {
          piVar1 = (int *)((long)pvVar9 + lVar22 * 4 + lVar31);
          *piVar1 = *piVar1 + local_8c0.data_[lVar22];
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x220);
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar7 - uVar7 % uVar14);
    }
    pvVar8 = BrotliAllocate(m,length);
    pvVar12 = BrotliAllocate(m,uVar14 * 0x1100);
    pvVar13 = BrotliAllocate(m,uVar14 * 8);
    sVar33 = (uVar14 + 7 >> 3) * length;
    if (sVar33 == 0) {
      __s = (void *)0x0;
    }
    else {
      __s = BrotliAllocate(m,sVar33);
    }
    p = BrotliAllocate(m,uVar14 * 2);
    lVar31 = 3;
    if (10 < *(int *)(max_histograms + 4)) {
      lVar31 = 10;
    }
    sVar33 = length - 1;
    lVar22 = 0;
    do {
      if (uVar14 < 2) {
        memset(pvVar8,0,length);
LAB_00119912:
        uVar7 = 1;
      }
      else {
        uVar10 = uVar14 + 7 >> 3;
        memset(pvVar12,0,uVar14 * 0x1100);
        uVar7 = 0;
        puVar23 = (uint *)((long)pvVar9 + 0x880);
        do {
          uVar32 = (ulong)*puVar23;
          if (uVar32 < 0x100) {
            dVar35 = kLog2Table[uVar32];
          }
          else {
            dVar35 = log2((double)uVar32);
          }
          *(double *)((long)pvVar12 + uVar7 * 8) = dVar35;
          uVar7 = uVar7 + 1;
          puVar23 = puVar23 + 0x224;
        } while (uVar14 != uVar7);
        pvVar24 = (void *)(uVar14 * 0x10f8 + (long)pvVar12);
        lVar27 = 0x220;
        puVar23 = (uint *)((long)pvVar9 + 0x87c);
        do {
          lVar27 = lVar27 + -1;
          uVar7 = 0;
          puVar30 = puVar23;
          do {
            dVar35 = *(double *)((long)pvVar12 + uVar7 * 8);
            uVar32 = (ulong)*puVar30;
            dVar34 = -2.0;
            if (uVar32 != 0) {
              if (*puVar30 < 0x100) {
                dVar34 = kLog2Table[uVar32];
              }
              else {
                dVar34 = log2((double)uVar32);
              }
            }
            *(double *)((long)pvVar24 + uVar7 * 8) = dVar35 - dVar34;
            uVar7 = uVar7 + 1;
            puVar30 = puVar30 + 0x224;
          } while (uVar14 != uVar7);
          pvVar24 = (void *)((long)pvVar24 + uVar14 * -8);
          puVar23 = puVar23 + -1;
        } while (lVar27 != 0);
        memset(pvVar13,0,uVar14 * 8);
        memset(__s,0,uVar10 * length);
        uVar7 = 0;
        do {
          uVar6 = data[uVar7];
          uVar32 = 0;
          dVar35 = 1e+99;
          do {
            dVar34 = *(double *)((long)pvVar12 + uVar32 * 8 + uVar6 * uVar14 * 8) +
                     *(double *)((long)pvVar13 + uVar32 * 8);
            *(double *)((long)pvVar13 + uVar32 * 8) = dVar34;
            if (dVar34 < dVar35) {
              *(char *)((long)pvVar8 + uVar7) = (char)uVar32;
              dVar35 = dVar34;
            }
            uVar32 = uVar32 + 1;
          } while (uVar14 != uVar32);
          dVar34 = 14.6;
          if (uVar7 < 2000) {
            dVar34 = (((double)(long)uVar7 * 0.07) / 2000.0 + 0.77) * 14.6;
          }
          uVar32 = 0;
          do {
            dVar36 = *(double *)((long)pvVar13 + uVar32 * 8) - dVar35;
            *(double *)((long)pvVar13 + uVar32 * 8) = dVar36;
            if (dVar34 <= dVar36) {
              *(double *)((long)pvVar13 + uVar32 * 8) = dVar34;
              pbVar2 = (byte *)((long)__s + (uVar32 >> 3) + uVar7 * uVar10);
              *pbVar2 = *pbVar2 | '\x01' << ((byte)uVar32 & 7);
            }
            uVar32 = uVar32 + 1;
          } while (uVar14 != uVar32);
          uVar7 = uVar7 + 1;
        } while (uVar7 != length);
        if (sVar33 == 0) goto LAB_00119912;
        bVar25 = *(byte *)((long)pvVar8 + sVar33);
        pvVar24 = (void *)((length - 2) * uVar10 + (long)__s);
        uVar7 = 1;
        sVar17 = length;
        do {
          if ((*(byte *)((long)pvVar24 + (ulong)(bVar25 >> 3)) >> (bVar25 & 7) & 1) != 0) {
            bVar28 = *(byte *)((long)pvVar8 + (sVar17 - 2));
            uVar7 = uVar7 + (bVar25 != bVar28);
            bVar25 = bVar28;
          }
          *(byte *)((long)pvVar8 + (sVar17 - 2)) = bVar25;
          pvVar24 = (void *)((long)pvVar24 - uVar10);
          sVar17 = sVar17 - 1;
        } while (sVar17 != 1);
      }
      if (uVar14 != 0) {
        uVar10 = 0;
        do {
          *(undefined2 *)((long)p + uVar10 * 2) = 0x100;
          uVar10 = uVar10 + 1;
        } while (uVar14 != uVar10);
      }
      sVar17 = 0;
      uVar6 = 0;
      do {
        if (*(short *)((long)p + (ulong)*(byte *)((long)pvVar8 + sVar17) * 2) == 0x100) {
          *(ushort *)((long)p + (ulong)*(byte *)((long)pvVar8 + sVar17) * 2) = uVar6;
          uVar6 = uVar6 + 1;
        }
        sVar17 = sVar17 + 1;
      } while (length != sVar17);
      sVar17 = 0;
      do {
        *(undefined1 *)((long)pvVar8 + sVar17) =
             *(undefined1 *)((long)p + (ulong)*(byte *)((long)pvVar8 + sVar17) * 2);
        sVar17 = sVar17 + 1;
      } while (length != sVar17);
      uVar14 = (ulong)uVar6;
      if (uVar6 != 0) {
        lVar27 = 0;
        do {
          memset((void *)((long)pvVar9 + lVar27),0,0x888);
          *(undefined8 *)((long)pvVar9 + lVar27 + 0x888) = 0x7ff0000000000000;
          lVar27 = lVar27 + 0x890;
        } while (uVar14 * 0x890 - lVar27 != 0);
      }
      sVar17 = 0;
      do {
        lVar27 = (ulong)*(byte *)((long)pvVar8 + sVar17) * 0x890;
        piVar1 = (int *)((long)pvVar9 + (ulong)data[sVar17] * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        plVar3 = (long *)((long)pvVar9 + lVar27 + 0x880);
        *plVar3 = *plVar3 + 1;
        sVar17 = sVar17 + 1;
      } while (length != sVar17);
      lVar22 = lVar22 + 1;
    } while (lVar22 != lVar31);
    BrotliFree(m,pvVar12);
    BrotliFree(m,pvVar13);
    BrotliFree(m,__s);
    BrotliFree(m,p);
    BrotliFree(m,pvVar9);
    if (uVar7 == 0) {
      local_d40 = (uint32_t *)0x0;
      pvVar9 = (void *)0x0;
    }
    else {
      local_d40 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
      pvVar9 = BrotliAllocate(m,uVar7 * 4);
    }
    uVar10 = uVar7 * 0x10 + 0x3f0;
    uVar14 = uVar10 >> 6;
    if (uVar10 < 0x40) {
      local_d70 = (HistogramDistance *)0x0;
      cluster_size = (uint32_t *)0x0;
    }
    else {
      local_d70 = (HistogramDistance *)BrotliAllocate(m,uVar14 * 0x890);
      cluster_size = (uint32_t *)BrotliAllocate(m,uVar14 * 4);
    }
    if (uVar7 == 0) {
      local_d50 = (HistogramDistance *)0x0;
    }
    else {
      uVar10 = 0x40;
      if (uVar7 < 0x40) {
        uVar10 = uVar7;
      }
      local_d50 = (HistogramDistance *)BrotliAllocate(m,uVar10 * 0x890);
    }
    local_ce0 = (HistogramPair *)BrotliAllocate(m,0xc018);
    lVar31 = 0;
    memset(sizes,0,0x100);
    memset(new_clusters,0,0x100);
    memset(symbols,0,0x100);
    memset(remap,0,0x100);
    memset(pvVar9,0,uVar7 * 4);
    sVar17 = 0;
    do {
      piVar1 = (int *)((long)pvVar9 + lVar31 * 4);
      *piVar1 = *piVar1 + 1;
      if ((sVar33 == sVar17) ||
         (*(char *)((long)pvVar8 + sVar17) != *(char *)((long)pvVar8 + sVar17 + 1))) {
        lVar31 = lVar31 + 1;
      }
      sVar17 = sVar17 + 1;
    } while (length != sVar17);
    if (uVar7 == 0) {
      uVar10 = 0;
    }
    else {
      local_ce8 = 0;
      local_cf0 = local_d70;
      local_d08 = 0;
      uVar19 = 0;
      uVar10 = 0;
      local_d58 = 0;
      uVar32 = uVar7;
      puVar16 = local_d40;
      local_d30 = uVar14;
      do {
        uVar21 = 0x40;
        if (uVar32 < 0x40) {
          uVar21 = uVar32;
        }
        lVar31 = uVar21 + (uVar21 == 0);
        sVar33 = uVar7 - uVar19;
        lVar22 = 0;
        do {
          pHVar15 = local_d50 + lVar22;
          memset(pHVar15,0,0x888);
          local_d50[lVar22].bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar9 + (uVar19 + lVar22) * 4) != 0) {
            sVar17 = pHVar15->total_count_;
            uVar21 = 0;
            do {
              pHVar15->data_[data[local_d58 + uVar21]] =
                   pHVar15->data_[data[local_d58 + uVar21]] + 1;
              uVar21 = uVar21 + 1;
            } while (uVar21 < *(uint *)((long)pvVar9 + (uVar19 + lVar22) * 4));
            pHVar15->total_count_ = sVar17 + uVar21;
            local_d58 = local_d58 + uVar21;
          }
          dVar35 = BrotliPopulationCostDistance(pHVar15);
          pHVar15->bit_cost_ = dVar35;
          new_clusters[lVar22] = (uint32_t)lVar22;
          symbols[lVar22] = (uint32_t)lVar22;
          sizes[lVar22] = 1;
          lVar22 = lVar22 + 1;
        } while (lVar22 != lVar31);
        if (0x3f < sVar33) {
          sVar33 = 0x40;
        }
        sVar33 = BrotliHistogramCombineDistance
                           (local_d50,sizes,symbols,new_clusters,local_ce0,sVar33,sVar33,0x40,0x800)
        ;
        uVar21 = local_ce8 + sVar33;
        if (local_d30 < uVar21) {
          uVar5 = local_d30;
          if (local_d30 == 0) {
            uVar5 = uVar21;
          }
          do {
            uVar18 = uVar5;
            uVar5 = uVar18 * 2;
          } while (uVar18 < uVar21);
          if (uVar18 == 0) {
            pHVar15 = (HistogramDistance *)0x0;
          }
          else {
            pHVar15 = (HistogramDistance *)BrotliAllocate(m,uVar18 * 0x890);
          }
          if (local_d30 != 0) {
            memcpy(pHVar15,local_cf0,local_d30 * 0x890);
          }
          BrotliFree(m,local_cf0);
          local_d30 = uVar18;
          local_cf0 = pHVar15;
        }
        uVar21 = local_d08 + sVar33;
        if (uVar14 < uVar21) {
          uVar5 = uVar14;
          if (uVar14 == 0) {
            uVar5 = uVar21;
          }
          do {
            uVar18 = uVar5;
            uVar5 = uVar18 * 2;
          } while (uVar18 < uVar21);
          if (uVar18 == 0) {
            __dest = (uint32_t *)0x0;
          }
          else {
            __dest = (uint32_t *)BrotliAllocate(m,uVar18 * 4);
          }
          if (uVar14 != 0) {
            memcpy(__dest,cluster_size,uVar14 << 2);
          }
          BrotliFree(m,cluster_size);
          uVar14 = uVar18;
          cluster_size = __dest;
        }
        if (sVar33 != 0) {
          pHVar15 = local_cf0 + local_ce8;
          sVar17 = 0;
          do {
            uVar29 = new_clusters[sVar17];
            memcpy(pHVar15,local_d50 + uVar29,0x890);
            cluster_size[local_d08 + sVar17] = sizes[uVar29];
            remap[new_clusters[sVar17]] = (uint32_t)sVar17;
            sVar17 = sVar17 + 1;
            pHVar15 = pHVar15 + 1;
          } while (sVar33 != sVar17);
          local_ce8 = local_ce8 + sVar17;
          local_d08 = local_d08 + sVar17;
        }
        lVar22 = 0;
        do {
          puVar16[lVar22] = remap[symbols[lVar22]] + (int)uVar10;
          lVar22 = lVar22 + 1;
        } while (lVar31 != lVar22);
        uVar10 = uVar10 + sVar33;
        uVar19 = uVar19 + 0x40;
        uVar32 = uVar32 - 0x40;
        puVar16 = puVar16 + 0x40;
        local_d70 = local_cf0;
      } while (uVar19 < uVar7);
    }
    BrotliFree(m,local_d50);
    uVar14 = (uVar10 >> 1) * uVar10;
    if (uVar10 << 6 < uVar14) {
      uVar14 = uVar10 << 6;
    }
    if (0x800 < uVar14) {
      BrotliFree(m,local_ce0);
      local_ce0 = (HistogramPair *)BrotliAllocate(m,uVar14 * 0x18 + 0x18);
    }
    if (uVar10 == 0) {
      puVar16 = (uint32_t *)0x0;
    }
    else {
      puVar16 = (uint32_t *)BrotliAllocate(m,uVar10 * 4);
      uVar32 = 0;
      do {
        puVar16[uVar32] = (uint32_t)uVar32;
        uVar32 = uVar32 + 1;
      } while (uVar10 != uVar32);
    }
    sVar33 = BrotliHistogramCombineDistance
                       (local_d70,cluster_size,local_d40,puVar16,local_ce0,uVar10,uVar7,0x100,uVar14
                       );
    BrotliFree(m,local_ce0);
    BrotliFree(m,cluster_size);
    if (uVar10 == 0) {
      pvVar12 = (void *)0x0;
    }
    else {
      pvVar12 = BrotliAllocate(m,uVar10 * 4);
      memset(pvVar12,0xff,uVar10 << 2);
    }
    if (uVar7 != 0) {
      iVar20 = 0;
      uVar14 = 0;
      local_d58 = 0;
      do {
        memset(&local_8c0,0,0x888);
        local_8c0.bit_cost_ = INFINITY;
        if (*(int *)((long)pvVar9 + uVar14 * 4) != 0) {
          uVar10 = 0;
          do {
            local_8c0.data_[data[local_d58 + uVar10]] =
                 local_8c0.data_[data[local_d58 + uVar10]] + 1;
            uVar10 = uVar10 + 1;
          } while (uVar10 < *(uint *)((long)pvVar9 + uVar14 * 4));
          local_d58 = local_d58 + uVar10;
          local_8c0.total_count_ = uVar10;
        }
        lVar31 = 0;
        if (uVar14 != 0) {
          lVar31 = uVar14 - 1;
        }
        uVar29 = local_d40[lVar31];
        uVar10 = (ulong)uVar29;
        local_d50 = (HistogramDistance *)
                    BrotliHistogramBitCostDistanceDistance(&local_8c0,local_d70 + uVar10);
        if (sVar33 != 0) {
          sVar17 = 0;
          do {
            dVar35 = BrotliHistogramBitCostDistanceDistance(&local_8c0,local_d70 + puVar16[sVar17]);
            if (dVar35 < (double)local_d50) {
              uVar10 = (ulong)puVar16[sVar17];
              local_d50 = (HistogramDistance *)dVar35;
            }
            uVar29 = (uint)uVar10;
            sVar17 = sVar17 + 1;
          } while (sVar33 != sVar17);
        }
        local_d40[uVar14] = uVar29;
        if (*(int *)((long)pvVar12 + (ulong)uVar29 * 4) == -1) {
          *(int *)((long)pvVar12 + (ulong)uVar29 * 4) = iVar20;
          iVar20 = iVar20 + 1;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar7);
    }
    BrotliFree(m,puVar16);
    BrotliFree(m,local_d70);
    uVar14 = *(ulong *)(sampling_stride_length + 0x20);
    if (uVar14 < uVar7) {
      if (uVar14 == 0) {
        uVar14 = uVar7;
      }
      do {
        uVar10 = uVar14;
        uVar14 = uVar10 * 2;
      } while (uVar10 < uVar7);
      if (uVar10 == 0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = BrotliAllocate(m,uVar10);
      }
      if (*(size_t *)(sampling_stride_length + 0x20) != 0) {
        memcpy(pvVar13,*(void **)(sampling_stride_length + 0x10),
               *(size_t *)(sampling_stride_length + 0x20));
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x10));
      *(void **)(sampling_stride_length + 0x10) = pvVar13;
      *(ulong *)(sampling_stride_length + 0x20) = uVar10;
    }
    uVar14 = *(ulong *)(sampling_stride_length + 0x28);
    if (uVar14 < uVar7) {
      if (uVar14 == 0) {
        uVar14 = uVar7;
      }
      do {
        uVar10 = uVar14;
        uVar14 = uVar10 * 2;
      } while (uVar10 < uVar7);
      if (uVar10 == 0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = BrotliAllocate(m,uVar10 * 4);
      }
      if (*(long *)(sampling_stride_length + 0x28) != 0) {
        memcpy(pvVar13,*(void **)(sampling_stride_length + 0x18),
               *(long *)(sampling_stride_length + 0x28) << 2);
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x18));
      *(void **)(sampling_stride_length + 0x18) = pvVar13;
      *(ulong *)(sampling_stride_length + 0x28) = uVar10;
    }
    iVar20 = 0;
    if (uVar7 == 0) {
      lVar22 = 1;
      lVar31 = 0;
    }
    else {
      uVar29 = 0;
      lVar31 = 0;
      uVar14 = 0;
      do {
        iVar20 = iVar20 + *(int *)((long)pvVar9 + uVar14 * 4);
        if ((uVar7 - 1 == uVar14) || (local_d40[uVar14] != local_d40[uVar14 + 1])) {
          uVar26 = uVar29 & 0xff;
          uVar4 = *(uint *)((long)pvVar12 + (ulong)local_d40[uVar14] * 4);
          bVar28 = (byte)uVar4;
          *(byte *)(*(long *)(sampling_stride_length + 0x10) + lVar31) = bVar28;
          bVar25 = (byte)uVar29;
          uVar29 = uVar4;
          if (bVar28 < bVar25) {
            uVar29 = uVar26;
          }
          *(int *)(*(long *)(sampling_stride_length + 0x18) + lVar31 * 4) = iVar20;
          lVar31 = lVar31 + 1;
          iVar20 = 0;
        }
        uVar14 = uVar14 + 1;
      } while (uVar7 != uVar14);
      lVar22 = (ulong)(uVar29 & 0xff) + 1;
    }
    *(long *)(sampling_stride_length + 8) = lVar31;
    *(long *)sampling_stride_length = lVar22;
    BrotliFree(m,pvVar12);
    BrotliFree(m,pvVar9);
    BrotliFree(m,local_d40);
    BrotliFree(m,pvVar8);
  }
  return;
}

Assistant:

static void FN(SplitByteVector)(MemoryManager* m,
                                const DataType* data, const size_t length,
                                const size_t literals_per_histogram,
                                const size_t max_histograms,
                                const size_t sampling_stride_length,
                                const double block_switch_cost,
                                const BrotliEncoderParams* params,
                                BlockSplit* split) {
  const size_t data_size = FN(HistogramDataSize)();
  size_t num_histograms = length / literals_per_histogram + 1;
  HistogramType* histograms;
  if (num_histograms > max_histograms) {
    num_histograms = max_histograms;
  }
  if (length == 0) {
    split->num_types = 1;
    return;
  } else if (length < kMinLengthForBlockSplitting) {
    BROTLI_ENSURE_CAPACITY(m, uint8_t,
        split->types, split->types_alloc_size, split->num_blocks + 1);
    BROTLI_ENSURE_CAPACITY(m, uint32_t,
        split->lengths, split->lengths_alloc_size, split->num_blocks + 1);
    if (BROTLI_IS_OOM(m)) return;
    split->num_types = 1;
    split->types[split->num_blocks] = 0;
    split->lengths[split->num_blocks] = (uint32_t)length;
    split->num_blocks++;
    return;
  }
  histograms = BROTLI_ALLOC(m, HistogramType, num_histograms);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(histograms)) return;
  /* Find good entropy codes. */
  FN(InitialEntropyCodes)(data, length,
                          sampling_stride_length,
                          num_histograms, histograms);
  FN(RefineEntropyCodes)(data, length,
                         sampling_stride_length,
                         num_histograms, histograms);
  {
    /* Find a good path through literals with the good entropy codes. */
    uint8_t* block_ids = BROTLI_ALLOC(m, uint8_t, length);
    size_t num_blocks = 0;
    const size_t bitmaplen = (num_histograms + 7) >> 3;
    double* insert_cost = BROTLI_ALLOC(m, double, data_size * num_histograms);
    double* cost = BROTLI_ALLOC(m, double, num_histograms);
    uint8_t* switch_signal = BROTLI_ALLOC(m, uint8_t, length * bitmaplen);
    uint16_t* new_id = BROTLI_ALLOC(m, uint16_t, num_histograms);
    const size_t iters = params->quality < HQ_ZOPFLIFICATION_QUALITY ? 3 : 10;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(block_ids) ||
        BROTLI_IS_NULL(insert_cost) || BROTLI_IS_NULL(cost) ||
        BROTLI_IS_NULL(switch_signal) || BROTLI_IS_NULL(new_id)) {
      return;
    }
    for (i = 0; i < iters; ++i) {
      num_blocks = FN(FindBlocks)(data, length,
                                  block_switch_cost,
                                  num_histograms, histograms,
                                  insert_cost, cost, switch_signal,
                                  block_ids);
      num_histograms = FN(RemapBlockIds)(block_ids, length,
                                         new_id, num_histograms);
      FN(BuildBlockHistograms)(data, length, block_ids,
                               num_histograms, histograms);
    }
    BROTLI_FREE(m, insert_cost);
    BROTLI_FREE(m, cost);
    BROTLI_FREE(m, switch_signal);
    BROTLI_FREE(m, new_id);
    BROTLI_FREE(m, histograms);
    FN(ClusterBlocks)(m, data, length, num_blocks, block_ids, split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, block_ids);
  }
}